

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O2

Path * tinyusdz::Path::make_root_path(void)

{
  Path *in_RDI;
  allocator local_62;
  allocator local_61;
  string local_60;
  string local_40;
  
  ::std::__cxx11::string::string((string *)&local_40,"/",&local_61);
  ::std::__cxx11::string::string((string *)&local_60,"",&local_62);
  Path(in_RDI,&local_40,&local_60);
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::assign((char *)&in_RDI->_element);
  in_RDI->_valid = true;
  return in_RDI;
}

Assistant:

static Path make_root_path() {
    Path p = Path("/", "");
    // elementPath is empty for root.
    p._element = "";
    p._valid = true;
    return p;
  }